

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::SystemInformationImplementation
          (SystemInformationImplementation *this)

{
  tagID::tagID(&this->ChipID);
  (this->SysCtlBuffer)._M_dataplus._M_p = (pointer)&(this->SysCtlBuffer).field_2;
  (this->SysCtlBuffer)._M_string_length = 0;
  (this->SysCtlBuffer).field_2._M_local_buf[0] = '\0';
  (this->OSName)._M_dataplus._M_p = (pointer)&(this->OSName).field_2;
  (this->OSName)._M_string_length = 0;
  (this->OSName).field_2._M_local_buf[0] = '\0';
  (this->Hostname)._M_dataplus._M_p = (pointer)&(this->Hostname).field_2;
  (this->Hostname)._M_string_length = 0;
  (this->Hostname).field_2._M_local_buf[0] = '\0';
  (this->OSRelease)._M_dataplus._M_p = (pointer)&(this->OSRelease).field_2;
  (this->OSRelease)._M_string_length = 0;
  (this->OSRelease).field_2._M_local_buf[0] = '\0';
  (this->OSVersion)._M_dataplus._M_p = (pointer)&(this->OSVersion).field_2;
  (this->OSVersion)._M_string_length = 0;
  (this->OSVersion).field_2._M_local_buf[0] = '\0';
  (this->OSPlatform)._M_dataplus._M_p = (pointer)&(this->OSPlatform).field_2;
  (this->OSPlatform)._M_string_length = 0;
  (this->OSPlatform).field_2._M_local_buf[0] = '\0';
  this->TotalVirtualMemory = 0;
  this->AvailableVirtualMemory = 0;
  this->TotalPhysicalMemory = 0;
  this->AvailablePhysicalMemory = 0;
  this->CurrentPositionInFile = 0;
  this->ChipManufacturer = UnknownManufacturer;
  this->CPUSpeedInMHz = 0.0;
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  (this->ChipID).Model = 0;
  (this->ChipID).Revision = 0;
  (this->ChipID).ExtendedFamily = 0;
  (this->ChipID).ExtendedModel = 0;
  *(undefined8 *)&(this->Features).ExtendedFeatures.PowerManagement = 0;
  (this->ChipID).Family = 0;
  (this->ChipID).Model = 0;
  (this->Features).ExtendedFeatures.Has3DNow = false;
  (this->Features).ExtendedFeatures.Has3DNowPlus = false;
  (this->Features).ExtendedFeatures.SupportsMP = false;
  (this->Features).ExtendedFeatures.HasMMXPlus = false;
  (this->Features).ExtendedFeatures.HasSSEMMX = false;
  (this->Features).ExtendedFeatures.SupportsHyperthreading = false;
  *(undefined2 *)&(this->Features).ExtendedFeatures.field_0x6 = 0;
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = 0;
  (this->Features).ExtendedFeatures.APIC_ID = 0;
  (this->Features).CPUSpeed = 0;
  (this->Features).L1CacheSize = 0;
  (this->Features).L2CacheSize = 0;
  (this->Features).L3CacheSize = 0;
  (this->Features).HasFPU = false;
  (this->Features).HasTSC = false;
  (this->Features).HasMMX = false;
  (this->Features).HasSSE = false;
  (this->Features).HasSSEFP = false;
  (this->Features).HasSSE2 = false;
  (this->Features).HasIA64 = false;
  (this->Features).HasAPIC = false;
  (this->Features).HasCMOV = false;
  (this->Features).HasMTRR = false;
  (this->Features).HasACPI = false;
  (this->Features).HasSerial = false;
  (this->Features).HasThermal = false;
  *(undefined3 *)&(this->Features).field_0xd = 0;
  std::__cxx11::string::assign((char *)&this->OSName);
  std::__cxx11::string::assign((char *)&this->Hostname);
  std::__cxx11::string::assign((char *)&this->OSRelease);
  std::__cxx11::string::assign((char *)&this->OSVersion);
  std::__cxx11::string::assign((char *)&this->OSPlatform);
  return;
}

Assistant:

SystemInformationImplementation::SystemInformationImplementation()
{
  this->TotalVirtualMemory = 0;
  this->AvailableVirtualMemory = 0;
  this->TotalPhysicalMemory = 0;
  this->AvailablePhysicalMemory = 0;
  this->CurrentPositionInFile = 0;
  this->ChipManufacturer = UnknownManufacturer;
  memset(&this->Features, 0, sizeof(CPUFeatures));
  this->ChipID.Type = 0;
  this->ChipID.Family = 0;
  this->ChipID.Model = 0;
  this->ChipID.Revision = 0;
  this->ChipID.ExtendedFamily = 0;
  this->ChipID.ExtendedModel = 0;
  this->CPUSpeedInMHz = 0;
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  this->OSName = "";
  this->Hostname = "";
  this->OSRelease = "";
  this->OSVersion = "";
  this->OSPlatform = "";
}